

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexTriangleAdjacency.cpp
# Opt level: O2

void __thiscall
Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
          (VertexTriangleAdjacency *this,aiFace *pcFaces,uint iNumFaces,uint iNumVertices,
          bool bComputeNumTriangles)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  long lVar8;
  aiFace *paVar9;
  ulong uVar10;
  char *__assertion;
  aiFace *pcFace;
  uint *puVar11;
  
  uVar10 = (ulong)iNumFaces;
  if (iNumVertices == 0) {
    iNumVertices = 0;
    paVar9 = pcFaces;
    for (lVar8 = uVar10 << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
      if (paVar9 == (aiFace *)0x0) {
        __assertion = "nullptr != pcFace";
        uVar5 = 0x3f;
LAB_00591668:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/VertexTriangleAdjacency.cpp"
                      ,uVar5,
                      "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                     );
      }
      if (paVar9->mNumIndices != 3) {
        __assertion = "3 == pcFace->mNumIndices";
        uVar5 = 0x40;
        goto LAB_00591668;
      }
      puVar11 = paVar9->mIndices;
      uVar5 = *puVar11;
      if (*puVar11 < iNumVertices) {
        uVar5 = iNumVertices;
      }
      if (uVar5 <= puVar11[1]) {
        uVar5 = puVar11[1];
      }
      iNumVertices = uVar5;
      if (uVar5 <= puVar11[2]) {
        iNumVertices = puVar11[2];
      }
      paVar9 = paVar9 + 1;
    }
  }
  uVar5 = iNumVertices + 1;
  this->mNumVertices = uVar5;
  if (bComputeNumTriangles) {
    puVar6 = (uint *)operator_new__((ulong)uVar5 << 2);
    this->mLiveTriangles = puVar6;
    memset(puVar6,0,(ulong)uVar5 << 2);
    pvVar7 = operator_new__((ulong)(iNumVertices + 2) << 2);
    puVar11 = (uint *)((long)pvVar7 + 4);
  }
  else {
    pvVar7 = operator_new__((ulong)(iNumVertices + 2) << 2);
    puVar6 = (uint *)((long)pvVar7 + 4);
    memset(puVar6,0,(ulong)uVar5 << 2);
    this->mLiveTriangles = (uint *)0x0;
    puVar11 = puVar6;
  }
  this->mOffsetTable = puVar11;
  puVar6[iNumVertices] = 0;
  paVar9 = pcFaces;
  for (lVar8 = uVar10 << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
    uVar5 = paVar9->mNumIndices;
    if (uVar5 != 0) {
      puVar4 = paVar9->mIndices;
      puVar6[*puVar4] = puVar6[*puVar4] + 1;
      if ((uVar5 != 1) && (puVar6[puVar4[1]] = puVar6[puVar4[1]] + 1, 2 < uVar5)) {
        puVar6[puVar4[2]] = puVar6[puVar4[2]] + 1;
      }
    }
    paVar9 = paVar9 + 1;
  }
  uVar5 = 0;
  for (lVar8 = 0; (ulong)iNumVertices * 4 + 4 != lVar8; lVar8 = lVar8 + 4) {
    iVar1 = *(int *)((long)puVar6 + lVar8);
    *(uint *)((long)puVar11 + lVar8) = uVar5;
    uVar5 = iVar1 + uVar5;
  }
  puVar6 = (uint *)operator_new__((ulong)uVar5 << 2);
  this->mAdjacencyTable = puVar6;
  uVar5 = 0;
  for (lVar8 = uVar10 << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
    uVar2 = pcFaces->mNumIndices;
    if (uVar2 != 0) {
      puVar6 = pcFaces->mIndices;
      puVar4 = this->mAdjacencyTable;
      uVar3 = puVar11[*puVar6];
      puVar11[*puVar6] = uVar3 + 1;
      puVar4[uVar3] = uVar5;
      if (uVar2 != 1) {
        puVar4 = this->mAdjacencyTable;
        uVar3 = puVar11[puVar6[1]];
        puVar11[puVar6[1]] = uVar3 + 1;
        puVar4[uVar3] = uVar5;
        if (2 < uVar2) {
          puVar4 = this->mAdjacencyTable;
          uVar2 = puVar11[puVar6[2]];
          puVar11[puVar6[2]] = uVar2 + 1;
          puVar4[uVar2] = uVar5;
        }
      }
    }
    pcFaces = pcFaces + 1;
    uVar5 = uVar5 + 1;
  }
  puVar11 = this->mOffsetTable;
  this->mOffsetTable = puVar11 + -1;
  puVar11[-1] = 0;
  return;
}

Assistant:

VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *pcFaces,
    unsigned int iNumFaces,
    unsigned int iNumVertices /*= 0*/,
    bool bComputeNumTriangles /*= false*/)
{
    // compute the number of referenced vertices if it wasn't specified by the caller
    const aiFace* const pcFaceEnd = pcFaces + iNumFaces;
    if (0 == iNumVertices)  {
        for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)   {
            ai_assert( nullptr != pcFace );
            ai_assert(3 == pcFace->mNumIndices);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[0]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[1]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[2]);
        }
    }

    mNumVertices = iNumVertices + 1;

    unsigned int* pi;

    // allocate storage
    if (bComputeNumTriangles)   {
        pi = mLiveTriangles = new unsigned int[iNumVertices+1];
        ::memset(mLiveTriangles,0,sizeof(unsigned int)*(iNumVertices+1));
        mOffsetTable = new unsigned int[iNumVertices+2]+1;
    } else {
        pi = mOffsetTable = new unsigned int[iNumVertices+2]+1;
        ::memset(mOffsetTable,0,sizeof(unsigned int)*(iNumVertices+1));
        mLiveTriangles = NULL; // important, otherwise the d'tor would crash
    }

    // get a pointer to the end of the buffer
    unsigned int* piEnd = pi+iNumVertices;
    *piEnd++ = 0u;

    // first pass: compute the number of faces referencing each vertex
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)
    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) pi[ind[0]]++;
        if (nind > 1) pi[ind[1]]++;
        if (nind > 2) pi[ind[2]]++;
    }

    // second pass: compute the final offset table
    unsigned int iSum = 0;
    unsigned int* piCurOut = this->mOffsetTable;
    for (unsigned int* piCur = pi; piCur != piEnd;++piCur,++piCurOut)   {

        unsigned int iLastSum = iSum;
        iSum += *piCur;
        *piCurOut = iLastSum;
    }
    pi = this->mOffsetTable;

    // third pass: compute the final table
    this->mAdjacencyTable = new unsigned int[iSum];
    iSum = 0;
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace,++iSum)    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;

        if (nind > 0) mAdjacencyTable[pi[ind[0]]++] = iSum;
        if (nind > 1) mAdjacencyTable[pi[ind[1]]++] = iSum;
        if (nind > 2) mAdjacencyTable[pi[ind[2]]++] = iSum;
    }
    // fourth pass: undo the offset computations made during the third pass
    // We could do this in a separate buffer, but this would be TIMES slower.
    --mOffsetTable;
    *mOffsetTable = 0u;
}